

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  ostream *this;
  char **in_RSI;
  int in_EDI;
  char *end_4;
  char *end_3;
  char *end_2;
  char *end_1;
  char *end;
  int opt;
  ProgramOptions po;
  ProgramOptions *in_stack_00000420;
  ProgramOptions *in_stack_fffffffffffffed0;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  int local_80;
  string local_70 [32];
  string asStack_50 [32];
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined4 local_2c;
  float local_28;
  undefined4 local_24;
  long local_20;
  long local_18;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ProgramOptions::ProgramOptions(in_stack_fffffffffffffed0);
  if (local_8 == 1) {
    ProgramOptions::usage((char **)0x103655);
  }
  while (local_80 = getopt(local_8,local_10,"hi:o:k:t:s:pebf:v:"), pcVar1 = _optarg, local_80 != -1)
  {
    switch(local_80) {
    case 0x3f:
      if ((_optopt == 0x69) || (_optopt == 0x6f)) {
        this = std::operator<<((ostream *)&std::cerr,"Options -i and -o require an argument.");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        ProgramOptions::usage((char **)0x10392d);
      }
      break;
    default:
      in_stack_fffffffffffffed0 =
           (ProgramOptions *)
           std::operator<<((ostream *)&std::cerr,"Some invalid option was supplied.");
      std::ostream::operator<<(in_stack_fffffffffffffed0,std::endl<char,std::char_traits<char>>);
      ProgramOptions::usage((char **)0x10396d);
      break;
    case 0x62:
      local_2f = 1;
      break;
    case 0x65:
      local_30 = 1;
      break;
    case 0x66:
      local_20 = strtol(_optarg,&local_e8,10);
      break;
    case 0x68:
      ProgramOptions::usage((char **)0x1036db);
      break;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
      std::__cxx11::string::operator=(local_70,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      break;
    case 0x6b:
      lVar2 = strtol(_optarg,&local_d8,10);
      local_2c = (undefined4)lVar2;
      break;
    case 0x6f:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
      std::__cxx11::string::operator=(asStack_50,local_c8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      break;
    case 0x70:
      local_2e = 1;
      break;
    case 0x73:
      local_28 = strtof(_optarg,&local_f8);
      break;
    case 0x74:
      lVar2 = strtol(_optarg,&local_e0,10);
      local_24 = (undefined4)lVar2;
      break;
    case 0x76:
      local_18 = strtol(_optarg,&local_f0,10);
    }
  }
  ProgramOptions::run(in_stack_00000420);
  local_4 = 0;
  ProgramOptions::~ProgramOptions(in_stack_fffffffffffffed0);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {

  ProgramOptions po;

  if (argc == 1) {
    ProgramOptions::usage(argv);
  }

  // Use GNU getopt to parse command line options
  int opt;
  while ((opt = getopt(argc, argv, "hi:o:k:t:s:pebf:v:")) != -1) {
    switch (opt) {

      case 'h': {
        ProgramOptions::usage(argv);
        break;
      }

      case 'i': {
        po.input_file = std::string(optarg);
        break;
      }

      case 'o': {
        po.output_file = std::string(optarg);
        break;
      }

      case 'k': {
        char *end;
        po.clusters = (unsigned int) std::strtol(optarg, &end, 10);
        break;
      }

      case 't': {
        char *end;
        po.threshold_iters = (unsigned int) std::strtol(optarg, &end, 10);
        break;
      }

      case 'f': {
        char *end;
        po.features = (unsigned long) std::strtol(optarg, &end, 10);
        break;
      }

      case 'v': {
        char *end;
        po.vectors = (unsigned long) std::strtol(optarg, &end, 10);
        break;
      }

      case 's': {
        char *end;
        po.scaling_factor = std::strtof(optarg, &end);
        break;
      }

      case 'p': {
        po.plot_outputs = true;
        break;
      }

      case 'e': {
        po.generate_example = true;
        break;
      }

      case 'b': {
        po.generate_benchmark = true;
        break;
      }

      case '?':
        if ((optopt == 'i') || (optopt == 'o')) {
          std::cerr << "Options -i and -o require an argument." << std::endl;
          ProgramOptions::usage(argv);
        }
        break;

      default: {
        std::cerr << "Some invalid option was supplied." << std::endl;
        ProgramOptions::usage(argv);
        break;
      }

    }
  }

  po.run();

  return 0;
}